

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::initBound(HModel *this,int phase)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  long lVar8;
  double dVar9;
  
  iVar1 = this->numCol;
  if (0 < (long)iVar1) {
    pdVar3 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->workRange).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      pdVar5[lVar8] = pdVar3[lVar8];
      dVar9 = pdVar4[lVar8];
      pdVar6[lVar8] = dVar9;
      pdVar7[lVar8] = dVar9 - pdVar5[lVar8];
      lVar8 = lVar8 + 1;
    } while (iVar1 != lVar8);
  }
  initPh2RowBound(this,0,this->numRow + -1);
  if ((phase != 2) && (iVar1 = this->numTot, 0 < (long)iVar1)) {
    pdVar3 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = this->numCol;
    pdVar5 = (this->workRange).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      dVar9 = pdVar4[lVar8];
      if ((pdVar3[lVar8] != -1e+200) || (NAN(pdVar3[lVar8]))) {
        pdVar3[lVar8] = 0.0;
        dVar9 = (double)(-(ulong)(dVar9 == 1e+200) & 0x3ff0000000000000);
LAB_00129c4a:
        pdVar4[lVar8] = dVar9;
        pdVar5[lVar8] = dVar9 - pdVar3[lVar8];
      }
      else {
        if ((dVar9 != 1e+200) || (NAN(dVar9))) {
          pdVar3[lVar8] = -1.0;
          dVar9 = 0.0;
          goto LAB_00129c4a;
        }
        if (lVar8 < iVar2) {
          pdVar3[lVar8] = -1000.0;
          dVar9 = 1000.0;
          goto LAB_00129c4a;
        }
      }
      lVar8 = lVar8 + 1;
    } while (iVar1 != lVar8);
  }
  return;
}

Assistant:

void HModel::initBound(int phase) {
  // Initialise the Phase 2 bounds (and ranges). NB Phase 2 bounds
  // necessary to compute Phase 1 bounds
  initPh2ColBound(0, numCol-1);
  initPh2RowBound(0, numRow-1);
  if (phase == 2) return;

  // In Phase 1: change to dual phase 1 bound
  const double inf = HSOL_CONST_INF;
  for (int i = 0; i < numTot; i++) {
    if (workLower[i] == -inf && workUpper[i] == inf) {
      // Won't change for row variables: they should never become
      // non basic
      if (i >= numCol) continue;
      workLower[i] = -1000, workUpper[i] = 1000;  // FREE
    } else if (workLower[i] == -inf) {
      workLower[i] = -1, workUpper[i] = 0;        // UPPER
    } else if (workUpper[i] == inf) {
      workLower[i] = 0, workUpper[i] = 1;         // LOWER
    } else {
      workLower[i] = 0, workUpper[i] = 0;         // BOXED or FIXED
    }
    workRange[i] = workUpper[i] - workLower[i];
  }
}